

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

Bool IsWhitespace(ctmbstr pString)

{
  Bool isWht;
  Bool BVar1;
  
  BVar1 = yes;
  for (; ((BVar1 != no && (pString != (char *)0x0)) && (*pString != '\0')); pString = pString + 1) {
    BVar1 = prvTidyIsWhite((int)*pString);
  }
  return BVar1;
}

Assistant:

static Bool IsWhitespace( ctmbstr pString )
{
    Bool isWht = yes;
    ctmbstr cp;

    for ( cp = pString; isWht && cp && *cp; ++cp )
    {
        isWht = TY_(IsWhite)( *cp );
    }
    return isWht;
}